

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

SUNErrCode N_VLinearCombination(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  _func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  long lVar2;
  
  UNRECOVERED_JUMPTABLE = z->ops->nvlinearcombination;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,X,z);
    return SVar1;
  }
  (*z->ops->nvscale)(*c,*X,z);
  for (lVar2 = 1; lVar2 < nvec; lVar2 = lVar2 + 1) {
    (*z->ops->nvlinearsum)(c[lVar2],X[lVar2],1.0,z,z);
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombination(int nvec, sunrealtype* c, N_Vector* X, N_Vector z)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (z->ops->nvlinearcombination != NULL)
  {
    ier = z->ops->nvlinearcombination(nvec, c, X, z);
  }
  else
  {
    z->ops->nvscale(c[0], X[0], z);
    for (i = 1; i < nvec; i++)
    {
      z->ops->nvlinearsum(c[i], X[i], SUN_RCONST(1.0), z, z);
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}